

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O2

void __thiscall duckdb::Linenoise::EditDeletePrevWord(Linenoise *this)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  pcVar1 = this->buf;
  sVar2 = this->pos;
  sVar4 = 0;
  sVar3 = sVar2;
  while (((sVar3 = sVar3 - 1, sVar3 != 0xffffffffffffffff && ((ulong)(byte)pcVar1[sVar3] < 0x21)) &&
         ((0x100002600U >> ((ulong)(byte)pcVar1[sVar3] & 0x3f) & 1) != 0))) {
    this->pos = sVar3;
    sVar4 = sVar4 + 1;
  }
  while ((sVar2 != sVar4 &&
         ((0x20 < (ulong)(byte)pcVar1[sVar3] ||
          ((0x100002600U >> ((ulong)(byte)pcVar1[sVar3] & 0x3f) & 1) == 0))))) {
    this->pos = sVar3;
    sVar4 = sVar4 + 1;
    sVar3 = sVar3 - 1;
  }
  memmove(pcVar1 + sVar3 + 1,pcVar1 + sVar2,(this->len - sVar2) + 1);
  this->len = this->len - sVar4;
  RefreshLine(this);
  return;
}

Assistant:

void Linenoise::EditDeletePrevWord() {
	size_t old_pos = pos;
	size_t diff;

	while (pos > 0 && IsSpace(buf[pos - 1])) {
		pos--;
	}
	while (pos > 0 && !IsSpace(buf[pos - 1])) {
		pos--;
	}
	diff = old_pos - pos;
	memmove(buf + pos, buf + old_pos, len - old_pos + 1);
	len -= diff;
	RefreshLine();
}